

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# CoeffBasedProduct.h
# Opt level: O2

void __thiscall
Eigen::
CoeffBasedProduct<Eigen::Matrix<double,2,1,0,2,1>,Eigen::Map<Eigen::Matrix<double,1,-1,1,1,2>,0,Eigen::Stride<0,0>>const,256>
::
CoeffBasedProduct<Eigen::Matrix<double,2,1,0,2,1>,Eigen::Map<Eigen::Matrix<double,1,_1,1,1,2>,0,Eigen::Stride<0,0>>>
          (CoeffBasedProduct<Eigen::Matrix<double,2,1,0,2,1>,Eigen::Map<Eigen::Matrix<double,1,_1,1,1,2>,0,Eigen::Stride<0,0>>const,256>
           *this,Matrix<double,_2,_1,_0,_2,_1> *lhs,
          Map<Eigen::Matrix<double,_1,__1,_1,_1,_2>,_0,_Eigen::Stride<0,_0>_> *rhs)

{
  PlainObjectBase<Eigen::Matrix<double,2,1,0,2,1>>::lazyAssign<Eigen::Matrix<double,2,1,0,2,1>>
            ((PlainObjectBase<Eigen::Matrix<double,2,1,0,2,1>> *)this,
             (DenseBase<Eigen::Matrix<double,_2,_1,_0,_2,_1>_> *)lhs);
  *(PointerType *)(this + 0x10) =
       (rhs->
       super_MapBase<Eigen::Map<Eigen::Matrix<double,_1,__1,_1,_1,_2>,_0,_Eigen::Stride<0,_0>_>,_1>)
       .super_MapBase<Eigen::Map<Eigen::Matrix<double,_1,__1,_1,_1,_2>,_0,_Eigen::Stride<0,_0>_>,_0>
       .m_data;
  *(long *)(this + 0x20) =
       (rhs->
       super_MapBase<Eigen::Map<Eigen::Matrix<double,_1,__1,_1,_1,_2>,_0,_Eigen::Stride<0,_0>_>,_1>)
       .super_MapBase<Eigen::Map<Eigen::Matrix<double,_1,__1,_1,_1,_2>,_0,_Eigen::Stride<0,_0>_>,_0>
       .m_cols.m_value;
  *(undefined8 *)(this + 0x50) = 0;
  return;
}

Assistant:

inline CoeffBasedProduct(const Lhs& lhs, const Rhs& rhs)
      : m_lhs(lhs), m_rhs(rhs)
    {
      // we don't allow taking products of matrices of different real types, as that wouldn't be vectorizable.
      // We still allow to mix T and complex<T>.
      EIGEN_STATIC_ASSERT((internal::scalar_product_traits<typename Lhs::RealScalar, typename Rhs::RealScalar>::Defined),
        YOU_MIXED_DIFFERENT_NUMERIC_TYPES__YOU_NEED_TO_USE_THE_CAST_METHOD_OF_MATRIXBASE_TO_CAST_NUMERIC_TYPES_EXPLICITLY)
      eigen_assert(lhs.cols() == rhs.rows()
        && "invalid matrix product"
        && "if you wanted a coeff-wise or a dot product use the respective explicit functions");
    }